

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::DBTest_ApproximateSizes_MixOfSmallAndLarge_Test::
DBTest_ApproximateSizes_MixOfSmallAndLarge_Test
          (DBTest_ApproximateSizes_MixOfSmallAndLarge_Test *this)

{
  DBTest::DBTest(&this->super_DBTest);
  (this->super_DBTest).super_Test._vptr_Test = (_func_int **)&PTR__DBTest_001950f0;
  return;
}

Assistant:

TEST_F(DBTest, ApproximateSizes_MixOfSmallAndLarge) {
  do {
    Options options = CurrentOptions();
    options.compression = kNoCompression;
    Reopen();

    Random rnd(301);
    std::string big1 = RandomString(&rnd, 100000);
    ASSERT_LEVELDB_OK(Put(Key(0), RandomString(&rnd, 10000)));
    ASSERT_LEVELDB_OK(Put(Key(1), RandomString(&rnd, 10000)));
    ASSERT_LEVELDB_OK(Put(Key(2), big1));
    ASSERT_LEVELDB_OK(Put(Key(3), RandomString(&rnd, 10000)));
    ASSERT_LEVELDB_OK(Put(Key(4), big1));
    ASSERT_LEVELDB_OK(Put(Key(5), RandomString(&rnd, 10000)));
    ASSERT_LEVELDB_OK(Put(Key(6), RandomString(&rnd, 300000)));
    ASSERT_LEVELDB_OK(Put(Key(7), RandomString(&rnd, 10000)));

    if (options.reuse_logs) {
      // Need to force a memtable compaction since recovery does not do so.
      ASSERT_LEVELDB_OK(dbfull()->TEST_CompactMemTable());
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      ASSERT_TRUE(Between(Size("", Key(0)), 0, 0));
      ASSERT_TRUE(Between(Size("", Key(1)), 10000, 11000));
      ASSERT_TRUE(Between(Size("", Key(2)), 20000, 21000));
      ASSERT_TRUE(Between(Size("", Key(3)), 120000, 121000));
      ASSERT_TRUE(Between(Size("", Key(4)), 130000, 131000));
      ASSERT_TRUE(Between(Size("", Key(5)), 230000, 231000));
      ASSERT_TRUE(Between(Size("", Key(6)), 240000, 241000));
      ASSERT_TRUE(Between(Size("", Key(7)), 540000, 541000));
      ASSERT_TRUE(Between(Size("", Key(8)), 550000, 560000));

      ASSERT_TRUE(Between(Size(Key(3), Key(5)), 110000, 111000));

      dbfull()->TEST_CompactRange(0, nullptr, nullptr);
    }
  } while (ChangeOptions());
}